

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestStartCommand.cxx
# Opt level: O0

bool __thiscall
cmCTestStartCommand::InitialPass
          (cmCTestStartCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmCTest *pcVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  byte bVar4;
  char *pcVar5;
  const_reference pvVar6;
  char *pcVar7;
  ostream *poVar8;
  string *psVar9;
  allocator<char> local_e21;
  string local_e20;
  int local_dfc;
  undefined1 local_df8 [4];
  int model;
  undefined1 local_dd8 [8];
  ostringstream e_1;
  string local_c58 [32];
  undefined1 local_c38 [8];
  ostringstream cmCTestLog_msg_3;
  undefined1 local_ac0 [8];
  cmGeneratedFileStream ofs;
  string startLogFile;
  undefined1 local_818 [8];
  ostringstream cmCTestLog_msg_2;
  char *group;
  undefined1 local_678 [8];
  ostringstream cmCTestLog_msg_1;
  string local_500 [32];
  undefined1 local_4e0 [8];
  ostringstream cmCTestLog_msg;
  undefined1 local_368 [8];
  string binaryDir;
  string sourceDir;
  string local_320;
  allocator<char> local_2f9;
  string local_2f8;
  allocator<char> local_2d1;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  string *local_288;
  allocator<char> local_279;
  string local_278;
  string *local_258;
  allocator<char> local_249;
  string local_248;
  cmValue local_228;
  cmValue local_220;
  string local_218;
  ostringstream local_1f8 [8];
  ostringstream e;
  cmValue local_80;
  cmValue bld_dir;
  cmValue src_dir;
  char *smodel;
  size_t cnt;
  allocator<char> local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmCTestStartCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  if (!bVar3) {
    smodel = (char *)0x0;
    src_dir.Value = (string *)0x0;
    cmValue::cmValue(&bld_dir);
    cmValue::cmValue(&local_80);
LAB_00209e0d:
    do {
      pcVar5 = (char *)std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_2_local);
      if (pcVar5 <= smodel) goto LAB_0020a1e8;
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local,(size_type)smodel);
      bVar3 = std::operator==(pvVar6,"GROUP");
      if (!bVar3) {
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_2_local,(size_type)smodel);
        bVar3 = std::operator==(pvVar6,"TRACK");
        if (!bVar3) {
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)param_2_local,(size_type)smodel);
          bVar3 = std::operator==(pvVar6,"APPEND");
          if (bVar3) {
            this->CreateNewTag = false;
          }
          else {
            pvVar6 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)param_2_local,(size_type)smodel);
            bVar3 = std::operator==(pvVar6,"QUIET");
            if (bVar3) {
              this->Quiet = true;
            }
            else if (src_dir.Value == (string *)0x0) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)param_2_local,(size_type)smodel);
              src_dir.Value = (string *)std::__cxx11::string::c_str();
            }
            else {
              bVar3 = cmValue::operator_cast_to_bool(&bld_dir);
              if (bVar3) {
                bVar3 = cmValue::operator_cast_to_bool(&local_80);
                if (bVar3) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_248,"Too many arguments",&local_249);
                  cmCommand::SetError((cmCommand *)this,&local_248);
                  std::__cxx11::string::~string((string *)&local_248);
                  std::allocator<char>::~allocator(&local_249);
                  this_local._7_1_ = 0;
                  goto LAB_0020b027;
                }
                pvVar6 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)param_2_local,(size_type)smodel);
                cmValue::cmValue(&local_228,pvVar6);
                local_80.Value = local_228.Value;
              }
              else {
                pvVar6 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)param_2_local,(size_type)smodel);
                cmValue::cmValue(&local_220,pvVar6);
                bld_dir.Value = local_220.Value;
              }
            }
          }
          smodel = smodel + 1;
          goto LAB_00209e0d;
        }
      }
      pcVar5 = smodel + 1;
      pcVar7 = (char *)std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_2_local);
      if (pcVar7 <= pcVar5) {
LAB_00209eed:
        std::__cxx11::ostringstream::ostringstream(local_1f8);
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_2_local,(size_type)smodel);
        poVar8 = std::operator<<((ostream *)local_1f8,(string *)pvVar6);
        std::operator<<(poVar8," argument missing group name");
        std::__cxx11::ostringstream::str();
        cmCommand::SetError((cmCommand *)this,&local_218);
        std::__cxx11::string::~string((string *)&local_218);
        this_local._7_1_ = 0;
        std::__cxx11::ostringstream::~ostringstream(local_1f8);
        goto LAB_0020b027;
      }
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local,(size_type)pcVar5);
      bVar3 = std::operator==(pvVar6,"APPEND");
      if (bVar3) goto LAB_00209eed;
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local,(size_type)pcVar5);
      bVar3 = std::operator==(pvVar6,"QUIET");
      if (bVar3) goto LAB_00209eed;
      pcVar1 = (this->super_cmCTestCommand).CTest;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local,(size_type)pcVar5);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCTest::SetSpecificGroup(pcVar1,pcVar5);
      smodel = smodel + 2;
    } while( true );
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"called with incorrect number of arguments",&local_49);
  cmCommand::SetError((cmCommand *)this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  this_local._7_1_ = 0;
LAB_0020b027:
  return (bool)(this_local._7_1_ & 1);
LAB_0020a1e8:
  bVar3 = cmValue::operator_cast_to_bool(&bld_dir);
  if (!bVar3) {
    pcVar2 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_278,"CTEST_SOURCE_DIRECTORY",&local_279);
    local_258 = (string *)cmMakefile::GetDefinition(pcVar2,&local_278);
    bld_dir.Value = local_258;
    std::__cxx11::string::~string((string *)&local_278);
    std::allocator<char>::~allocator(&local_279);
  }
  bVar3 = cmValue::operator_cast_to_bool(&local_80);
  if (!bVar3) {
    pcVar2 = (this->super_cmCTestCommand).super_cmCommand.Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,"CTEST_BINARY_DIRECTORY",&local_2a9);
    local_288 = (string *)cmMakefile::GetDefinition(pcVar2,&local_2a8);
    local_80 = (cmValue)local_288;
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator(&local_2a9);
  }
  bVar3 = cmValue::operator_cast_to_bool(&bld_dir);
  if (bVar3) {
    bVar3 = cmValue::operator_cast_to_bool(&local_80);
    if (bVar3) {
      if ((src_dir.Value == (string *)0x0) && ((this->CreateNewTag & 1U) != 0)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_320,
                   "no test model specified and APPEND not specified. Specify either a test model or the APPEND argument"
                   ,(allocator<char> *)(sourceDir.field_2._M_local_buf + 0xf));
        cmCommand::SetError((cmCommand *)this,&local_320);
        std::__cxx11::string::~string((string *)&local_320);
        std::allocator<char>::~allocator((allocator<char> *)(sourceDir.field_2._M_local_buf + 0xf));
        this_local._7_1_ = 0;
      }
      else {
        psVar9 = cmValue::operator*[abi_cxx11_(&bld_dir);
        cmsys::SystemTools::AddKeepPath(psVar9);
        psVar9 = cmValue::operator*[abi_cxx11_(&local_80);
        cmsys::SystemTools::AddKeepPath(psVar9);
        cmCTest::EmptyCTestConfiguration((this->super_cmCTestCommand).CTest);
        psVar9 = cmValue::operator*[abi_cxx11_(&bld_dir);
        cmsys::SystemTools::CollapseFullPath((string *)((long)&binaryDir.field_2 + 8),psVar9);
        psVar9 = cmValue::operator*[abi_cxx11_(&local_80);
        cmsys::SystemTools::CollapseFullPath((string *)local_368,psVar9);
        cmCTest::SetCTestConfiguration
                  ((this->super_cmCTestCommand).CTest,"SourceDirectory",
                   (string *)((long)&binaryDir.field_2 + 8),(bool)(this->Quiet & 1));
        cmCTest::SetCTestConfiguration
                  ((this->super_cmCTestCommand).CTest,"BuildDirectory",(string *)local_368,
                   (bool)(this->Quiet & 1));
        if (src_dir.Value == (string *)0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_678);
          poVar8 = std::operator<<((ostream *)local_678,"Run dashboard with to-be-determined model")
          ;
          poVar8 = (ostream *)
                   std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          poVar8 = std::operator<<(poVar8,"   Source directory: ");
          psVar9 = cmValue::operator*[abi_cxx11_(&bld_dir);
          poVar8 = std::operator<<(poVar8,(string *)psVar9);
          poVar8 = (ostream *)
                   std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          poVar8 = std::operator<<(poVar8,"   Build directory: ");
          psVar9 = cmValue::operator*[abi_cxx11_(&local_80);
          poVar8 = std::operator<<(poVar8,(string *)psVar9);
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestCommand).CTest;
          std::__cxx11::ostringstream::str();
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestStartCommand.cxx"
                       ,0x74,pcVar5,(bool)(this->Quiet & 1));
          std::__cxx11::string::~string((string *)&group);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_678);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4e0);
          poVar8 = std::operator<<((ostream *)local_4e0,"Run dashboard with model ");
          poVar8 = std::operator<<(poVar8,(char *)src_dir.Value);
          poVar8 = (ostream *)
                   std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          poVar8 = std::operator<<(poVar8,"   Source directory: ");
          psVar9 = cmValue::operator*[abi_cxx11_(&bld_dir);
          poVar8 = std::operator<<(poVar8,(string *)psVar9);
          poVar8 = (ostream *)
                   std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          poVar8 = std::operator<<(poVar8,"   Build directory: ");
          psVar9 = cmValue::operator*[abi_cxx11_(&local_80);
          poVar8 = std::operator<<(poVar8,(string *)psVar9);
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestCommand).CTest;
          std::__cxx11::ostringstream::str();
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestStartCommand.cxx"
                       ,0x6c,pcVar5,(bool)(this->Quiet & 1));
          std::__cxx11::string::~string(local_500);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4e0);
        }
        pcVar5 = cmCTest::GetSpecificGroup((this->super_cmCTestCommand).CTest);
        if (pcVar5 != (char *)0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_818);
          poVar8 = std::operator<<((ostream *)local_818,"   Group: ");
          poVar8 = std::operator<<(poVar8,pcVar5);
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestCommand).CTest;
          std::__cxx11::ostringstream::str();
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestStartCommand.cxx"
                       ,0x79,pcVar5,(bool)(this->Quiet & 1));
          std::__cxx11::string::~string((string *)(startLogFile.field_2._M_local_buf + 8));
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_818);
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &ofs.field_0x260,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_368,"/Testing/Temporary/LastStart.log");
        cmGeneratedFileStream::cmGeneratedFileStream
                  ((cmGeneratedFileStream *)local_ac0,(string *)&ofs.field_0x260,false,None);
        bVar4 = std::ios::operator!((ios *)(local_ac0 +
                                           (long)*(_func_int **)((long)local_ac0 + -0x18)));
        if ((bVar4 & 1) == 0) {
          bVar3 = InitialCheckout(this,(ostream *)local_ac0,(string *)((long)&binaryDir.field_2 + 8)
                                 );
          if (bVar3) {
            bVar3 = cmsys::SystemTools::FileIsDirectory((string *)((long)&binaryDir.field_2 + 8));
            if (bVar3) {
              cmCTest::SetRunCurrentScript((this->super_cmCTestCommand).CTest,false);
              cmCTest::SetSuppressUpdatingCTestConfiguration
                        ((this->super_cmCTestCommand).CTest,true);
              if (src_dir.Value == (string *)0x0) {
                local_dfc = -1;
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_e20,(char *)src_dir.Value,&local_e21);
                local_dfc = cmCTest::GetTestModelFromString(&local_e20);
                std::__cxx11::string::~string((string *)&local_e20);
                std::allocator<char>::~allocator(&local_e21);
              }
              cmCTest::SetTestModel((this->super_cmCTestCommand).CTest,local_dfc);
              cmCTest::SetProduceXML((this->super_cmCTestCommand).CTest,true);
              this_local._7_1_ =
                   cmCTest::InitializeFromCommand((this->super_cmCTestCommand).CTest,this);
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_dd8);
              poVar8 = std::operator<<((ostream *)local_dd8,"given source path\n");
              poVar8 = std::operator<<(poVar8,"  ");
              poVar8 = std::operator<<(poVar8,(string *)(binaryDir.field_2._M_local_buf + 8));
              poVar8 = std::operator<<(poVar8,"\n");
              poVar8 = std::operator<<(poVar8,"which is not an existing directory.  ");
              std::operator<<(poVar8,"Set CTEST_CHECKOUT_COMMAND to a command line to create it.");
              std::__cxx11::ostringstream::str();
              cmCommand::SetError((cmCommand *)this,(string *)local_df8);
              std::__cxx11::string::~string((string *)local_df8);
              this_local._7_1_ = 0;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_dd8);
            }
          }
          else {
            this_local._7_1_ = 0;
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c38);
          poVar8 = std::operator<<((ostream *)local_c38,"Cannot create log file: LastStart.log");
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestCommand).CTest;
          std::__cxx11::ostringstream::str();
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestStartCommand.cxx"
                       ,0x81,pcVar5,false);
          std::__cxx11::string::~string(local_c58);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c38);
          this_local._7_1_ = 0;
        }
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_ac0);
        std::__cxx11::string::~string((string *)&ofs.field_0x260);
        std::__cxx11::string::~string((string *)local_368);
        std::__cxx11::string::~string((string *)(binaryDir.field_2._M_local_buf + 8));
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2f8,
                 "binary directory not specified. Specify binary directory as an argument or set CTEST_BINARY_DIRECTORY"
                 ,&local_2f9);
      cmCommand::SetError((cmCommand *)this,&local_2f8);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::allocator<char>::~allocator(&local_2f9);
      this_local._7_1_ = 0;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d0,
               "source directory not specified. Specify source directory as an argument or set CTEST_SOURCE_DIRECTORY"
               ,&local_2d1);
    cmCommand::SetError((cmCommand *)this,&local_2d0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::allocator<char>::~allocator(&local_2d1);
    this_local._7_1_ = 0;
  }
  goto LAB_0020b027;
}

Assistant:

bool cmCTestStartCommand::InitialPass(std::vector<std::string> const& args,
                                      cmExecutionStatus& /*unused*/)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  size_t cnt = 0;
  const char* smodel = nullptr;
  cmValue src_dir;
  cmValue bld_dir;

  while (cnt < args.size()) {
    if (args[cnt] == "GROUP" || args[cnt] == "TRACK") {
      cnt++;
      if (cnt >= args.size() || args[cnt] == "APPEND" ||
          args[cnt] == "QUIET") {
        std::ostringstream e;
        e << args[cnt - 1] << " argument missing group name";
        this->SetError(e.str());
        return false;
      }
      this->CTest->SetSpecificGroup(args[cnt].c_str());
      cnt++;
    } else if (args[cnt] == "APPEND") {
      cnt++;
      this->CreateNewTag = false;
    } else if (args[cnt] == "QUIET") {
      cnt++;
      this->Quiet = true;
    } else if (!smodel) {
      smodel = args[cnt].c_str();
      cnt++;
    } else if (!src_dir) {
      src_dir = cmValue(args[cnt]);
      cnt++;
    } else if (!bld_dir) {
      bld_dir = cmValue(args[cnt]);
      cnt++;
    } else {
      this->SetError("Too many arguments");
      return false;
    }
  }

  if (!src_dir) {
    src_dir = this->Makefile->GetDefinition("CTEST_SOURCE_DIRECTORY");
  }
  if (!bld_dir) {
    bld_dir = this->Makefile->GetDefinition("CTEST_BINARY_DIRECTORY");
  }
  if (!src_dir) {
    this->SetError("source directory not specified. Specify source directory "
                   "as an argument or set CTEST_SOURCE_DIRECTORY");
    return false;
  }
  if (!bld_dir) {
    this->SetError("binary directory not specified. Specify binary directory "
                   "as an argument or set CTEST_BINARY_DIRECTORY");
    return false;
  }
  if (!smodel && this->CreateNewTag) {
    this->SetError("no test model specified and APPEND not specified. Specify "
                   "either a test model or the APPEND argument");
    return false;
  }

  cmSystemTools::AddKeepPath(*src_dir);
  cmSystemTools::AddKeepPath(*bld_dir);

  this->CTest->EmptyCTestConfiguration();

  std::string sourceDir = cmSystemTools::CollapseFullPath(*src_dir);
  std::string binaryDir = cmSystemTools::CollapseFullPath(*bld_dir);
  this->CTest->SetCTestConfiguration("SourceDirectory", sourceDir,
                                     this->Quiet);
  this->CTest->SetCTestConfiguration("BuildDirectory", binaryDir, this->Quiet);

  if (smodel) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "Run dashboard with model "
                         << smodel << std::endl
                         << "   Source directory: " << *src_dir << std::endl
                         << "   Build directory: " << *bld_dir << std::endl,
                       this->Quiet);
  } else {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "Run dashboard with "
                       "to-be-determined model"
                         << std::endl
                         << "   Source directory: " << *src_dir << std::endl
                         << "   Build directory: " << *bld_dir << std::endl,
                       this->Quiet);
  }
  const char* group = this->CTest->GetSpecificGroup();
  if (group) {
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                       "   Group: " << group << std::endl, this->Quiet);
  }

  // Log startup actions.
  std::string startLogFile = binaryDir + "/Testing/Temporary/LastStart.log";
  cmGeneratedFileStream ofs(startLogFile);
  if (!ofs) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create log file: LastStart.log" << std::endl);
    return false;
  }

  // Make sure the source directory exists.
  if (!this->InitialCheckout(ofs, sourceDir)) {
    return false;
  }
  if (!cmSystemTools::FileIsDirectory(sourceDir)) {
    std::ostringstream e;
    e << "given source path\n"
      << "  " << sourceDir << "\n"
      << "which is not an existing directory.  "
      << "Set CTEST_CHECKOUT_COMMAND to a command line to create it.";
    this->SetError(e.str());
    return false;
  }

  this->CTest->SetRunCurrentScript(false);
  this->CTest->SetSuppressUpdatingCTestConfiguration(true);
  int model;
  if (smodel) {
    model = cmCTest::GetTestModelFromString(smodel);
  } else {
    model = cmCTest::UNKNOWN;
  }
  this->CTest->SetTestModel(model);
  this->CTest->SetProduceXML(true);

  return this->CTest->InitializeFromCommand(this);
}